

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImgProcessor.cpp
# Opt level: O1

ImgProcessor * __thiscall
pobr::imgProcessing::ImgProcessor::processBinaryEnhance
          (ImgProcessor *this,Mat *img,bool *isProfiling)

{
  ulong *puVar1;
  size_type *psVar2;
  undefined8 *puVar3;
  char *in_RCX;
  undefined8 uVar4;
  ulong uVar5;
  double dVar6;
  PerformanceTimer profiler;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  undefined8 uStack_c0;
  string local_b8;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  PerformanceTimer local_38;
  
  cv::Mat::Mat(&this->img,(Mat *)isProfiling);
  local_38.pointStart.__d.__r = (duration)0;
  local_38.pointStop.__d.__r = (duration)0;
  pobr::utils::PerformanceTimer::start(&local_38);
  pobr::utils::PerformanceTimer::stop(&local_38);
  if (*in_RCX != '\x01') {
    return this;
  }
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"BinaryEnhance phase took: ","");
  dVar6 = pobr::utils::PerformanceTimer::getDurationNS(&local_38);
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_78,vsnprintf,0x148,"%f",dVar6 / 1000000.0);
  uVar5 = 0xf;
  if (local_58 != local_48) {
    uVar5 = local_48[0];
  }
  if (uVar5 < local_78._M_string_length + local_50) {
    uVar4 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      uVar4 = local_78.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar4 < local_78._M_string_length + local_50) goto LAB_0010c7c5;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_58);
  }
  else {
LAB_0010c7c5:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78._M_dataplus._M_p);
  }
  local_d8 = &local_c8;
  puVar1 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar1) {
    local_c8 = *puVar1;
    uStack_c0 = puVar3[3];
  }
  else {
    local_c8 = *puVar1;
    local_d8 = (ulong *)*puVar3;
  }
  local_d0 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"ms","");
  uVar5 = 0xf;
  if (local_d8 != &local_c8) {
    uVar5 = local_c8;
  }
  if (uVar5 < (ulong)(local_90 + local_d0)) {
    uVar5 = 0xf;
    if (local_98 != local_88) {
      uVar5 = local_88[0];
    }
    if ((ulong)(local_90 + local_d0) <= uVar5) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_d8);
      goto LAB_0010c8ae;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_98);
LAB_0010c8ae:
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  psVar2 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_b8.field_2._M_allocated_capacity = *psVar2;
    local_b8.field_2._8_8_ = puVar3[3];
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar2;
    local_b8._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_b8._M_string_length = puVar3[1];
  *puVar3 = psVar2;
  puVar3[1] = 0;
  *(undefined1 *)psVar2 = 0;
  pobr::utils::Logger::notice(&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  return this;
}

Assistant:

cv::Mat
ImgProcessor::processBinaryEnhance(const cv::Mat& img, const bool& isProfiling)
const
{
    auto resultImg = img;

    PerformanceTimer profiler;

    profiler.start();

    // Note: currently disabled, as it's:
    //       1. not needed in here
    //       2. breaks some logos recognition

    // resultImg = enhance::erodeImage(
    //     resultImg,
    //     3
    // );
    // resultImg = enhance::dilateImage(
    //     resultImg,
    //     3
    // );

    profiler.stop();

    if (isProfiling) {
        Logger::notice(
            std::string("BinaryEnhance phase took: ") +
            std::to_string(profiler.getDurationNS() / 1000000) +
            std::string("ms")
        );
    }

    return resultImg;
}